

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O1

defV * __thiscall
helics::apps::SineGenerator::generate_abi_cxx11_
          (defV *__return_storage_ptr__,SineGenerator *this,Time signalTime)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  lVar3 = signalTime.internalTimeCode - (this->super_SignalGenerator).lastTime.internalTimeCode;
  lVar6 = signalTime.internalTimeCode - (this->lastCycle).internalTimeCode;
  dVar1 = (double)(lVar3 % 1000000000) * 1e-09 + (double)(lVar3 / 1000000000);
  dVar9 = this->dfdt * dVar1 + this->frequency;
  this->frequency = dVar9;
  dVar2 = dVar1 * this->dAdt + this->amplitude;
  this->amplitude = dVar2;
  dVar1 = this->level;
  dVar8 = sin(((double)(lVar6 % 1000000000) * 1e-09 + (double)(lVar6 / 1000000000)) * dVar9 *
              6.283185307179586 + this->offset);
  uVar7 = -(ulong)(0.0 < this->frequency);
  dVar9 = (double)(~uVar7 & 0x476812f9cf7920e3 | (ulong)(1.0 / this->frequency) & uVar7);
  this->period = dVar9;
  lVar3 = (long)(dVar9 * 1000000000.0 +
                *(double *)(&DAT_00419b20 + (ulong)(0.0 <= dVar9 * 1000000000.0) * 8));
  lVar4 = lVar3;
  if (9223372036.854765 <= dVar9) {
    lVar4 = 0x7fffffffffffffff;
  }
  if (dVar9 <= -9223372036.854765) {
    lVar4 = -0x7fffffffffffffff;
  }
  if (lVar4 < lVar6) {
    if (9223372036.854765 <= dVar9) {
      lVar3 = 0x7fffffffffffffff;
    }
    lVar5 = (this->lastCycle).internalTimeCode;
    if (dVar9 <= -9223372036.854765) {
      lVar3 = -0x7fffffffffffffff;
    }
    do {
      lVar6 = lVar6 - lVar3;
      lVar5 = lVar5 + lVar3;
    } while (lVar4 < lVar6);
    (this->lastCycle).internalTimeCode = lVar5;
  }
  (this->super_SignalGenerator).lastTime.internalTimeCode = signalTime.internalTimeCode;
  *(double *)
   &(__return_storage_ptr__->
    super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ).
    super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    ._M_u = dVar2 * dVar8 + dVar1;
  (__return_storage_ptr__->
  super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ).
  super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  ._M_index = '\0';
  return __return_storage_ptr__;
}

Assistant:

defV SineGenerator::generate(Time signalTime)
    {
        auto dt = signalTime - lastTime;
        auto tdiff = signalTime - lastCycle;
        // account for the frequency shift
        frequency += dfdt * dt;
        amplitude += dAdt * dt;
        // compute the sine wave component
        double newValue = level + amplitude * sin(2.0 * pi * (frequency * tdiff) + offset);
        period = (frequency > 0.0) ? 1.0 / frequency : 1e36;
        while (tdiff > period) {
            tdiff -= period;
            lastCycle += period;
        }
        lastTime = signalTime;
        return newValue;
    }